

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSet.cpp
# Opt level: O1

bool __thiscall xercesc_4_0::BitSet::equals(BitSet *this,BitSet *other)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  if (this == other) {
    return true;
  }
  uVar1 = this->fUnitLen;
  if (uVar1 != other->fUnitLen) {
    return false;
  }
  bVar4 = uVar1 == 0;
  if (!bVar4) {
    if (*this->fBits == *other->fBits) {
      uVar2 = 1;
      do {
        uVar3 = uVar2;
        if (uVar1 == uVar3) break;
        uVar2 = uVar3 + 1;
      } while (this->fBits[uVar3] == other->fBits[uVar3]);
      bVar4 = uVar1 <= uVar3;
    }
  }
  return bVar4;
}

Assistant:

bool BitSet::equals(const BitSet& other) const
{
    if (this == &other)
        return true;

    if (fUnitLen != other.fUnitLen)
        return false;

    for (XMLSize_t i = 0; i < fUnitLen; i++)
    {
        if (fBits[i] != other.fBits[i])
            return false;
    }
    return true;
}